

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O0

kvtree * kvtree_set(kvtree *hash,char *key,kvtree *hash_value)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *local_30;
  kvtree_elem *elem;
  kvtree *hash_value_local;
  char *key_local;
  kvtree *hash_local;
  
  if ((hash == (kvtree *)0x0) || (key == (char *)0x0)) {
    hash_local = (kvtree *)0x0;
  }
  else {
    local_30 = kvtree_elem_extract(hash,key);
    if (local_30 == (kvtree_elem *)0x0) {
      local_30 = kvtree_elem_new();
      kvtree_elem_init(local_30,key,hash_value);
    }
    else {
      if (local_30->hash != (kvtree_struct *)0x0) {
        kvtree_delete(&local_30->hash);
      }
      local_30->hash = hash_value;
    }
    pkVar1 = hash->lh_first;
    (local_30->pointers).le_next = pkVar1;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (hash->lh_first->pointers).le_prev = &(local_30->pointers).le_next;
    }
    hash->lh_first = local_30;
    (local_30->pointers).le_prev = &hash->lh_first;
    hash_local = local_30->hash;
  }
  return hash_local;
}

Assistant:

kvtree* kvtree_set(kvtree* hash, const char* key, kvtree* hash_value)
{
  /* check that we have a valid hash to insert into and a valid key
   * name */
  if (hash == NULL || key == NULL) {
    return NULL;
  }

  /* if there is a match in the hash, pull out that element */
  kvtree_elem* elem = kvtree_elem_extract(hash, key);
  if (elem == NULL) {
    /* nothing found, so create a new element and set it */
    elem = kvtree_elem_new();
    kvtree_elem_init(elem, key, hash_value);
  } else {
    /* this key already exists, delete its current hash and reset it */
    if (elem->hash != NULL) {
      kvtree_delete(&elem->hash);
    }
    elem->hash = hash_value;
  }

  /* insert the element into the hash */
  LIST_INSERT_HEAD(hash, elem, pointers);

  /* return the pointer to the hash of the element */
  return elem->hash;
}